

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O2

void DThinker::SaveList(FSerializer *arc,DThinker *node)

{
  DThinker *local_18;
  
  local_18 = node;
  if (node != (DThinker *)0x0) {
    while (((local_18->super_DObject).ObjectFlags & 0x400) == 0) {
      if ((local_18->NextThinker == (DThinker *)0x0) ||
         (((local_18->NextThinker->super_DObject).ObjectFlags & 0x20) != 0)) {
        __assert_fail("node->NextThinker != NULL && !(node->NextThinker->ObjectFlags & OF_EuthanizeMe)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                      ,0x8f,"static void DThinker::SaveList(FSerializer &, DThinker *)");
      }
      Serialize<DThinker>(arc,(char *)0x0,&local_18,(DThinker **)0x0);
      local_18 = local_18->NextThinker;
    }
  }
  return;
}

Assistant:

void DThinker::SaveList(FSerializer &arc, DThinker *node)
{
	if (node != NULL)
	{
		while (!(node->ObjectFlags & OF_Sentinel))
		{
			assert(node->NextThinker != NULL && !(node->NextThinker->ObjectFlags & OF_EuthanizeMe));
			::Serialize<DThinker>(arc, nullptr, node, nullptr);
			node = node->NextThinker;
		}
	}
}